

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O0

size_t lzham::lzham_msize(lzham_malloc_context context,void *p)

{
  bool bVar1;
  uint uVar2;
  void *in_RSI;
  malloc_context *in_RDI;
  malloc_context *pContext;
  uint in_stack_000001d4;
  char *in_stack_000001d8;
  char *in_stack_000001e0;
  char *in_stack_ffffffffffffffd8;
  lzham_malloc_context in_stack_ffffffffffffffe0;
  ulong local_8;
  
  if (in_RSI == (void *)0x0) {
    local_8 = 0;
  }
  else if (((ulong)in_RSI & 0xf) == 0) {
    if (in_RDI->m_sig != 0x5749abcd) {
      lzham_assert(in_stack_000001e0,in_stack_000001d8,in_stack_000001d4);
    }
    bVar1 = malloc_context::ptr_is_in_arena(in_RDI,in_RSI);
    if (bVar1) {
      uVar2 = malloc_context::arena_msize(in_RDI,in_RSI);
      local_8 = (ulong)uVar2;
    }
    else {
      local_8 = (*(code *)g_pMSize)(in_RSI,g_pUser_data);
    }
  }
  else {
    lzham_mem_error(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t lzham_msize(lzham_malloc_context context, void* p)
   {
      if (!p)
         return 0;

      if (reinterpret_cast<ptr_bits_t>(p) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1))
      {
         lzham_mem_error(context, "lzham_msize: bad ptr");
         return 0;
      }

      malloc_context *pContext = static_cast<malloc_context *>(context);
      LZHAM_VERIFY(pContext->m_sig == malloc_context::cSig);

      if (pContext->ptr_is_in_arena(p))
      {
         return pContext->arena_msize(p);
      }
      else
      {
         return (*g_pMSize)(p, g_pUser_data);
      }
   }